

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O3

_Bool intersect_box3_ray3(box3_t b,ray3_t r)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fVar6 = r.start.x;
  auVar3._0_4_ = b.min.x - fVar6;
  fVar8 = r.start.y;
  auVar3._4_4_ = b.min.y - fVar8;
  auVar3._8_8_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = r.direction.x;
  auVar4._4_4_ = r.direction.y;
  auVar4 = divps(auVar3,auVar4);
  auVar9._0_4_ = b.max.x - fVar6;
  auVar9._4_4_ = b.max.y - fVar8;
  auVar9._8_8_ = 0;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = r.direction.x;
  auVar10._4_4_ = r.direction.y;
  auVar10 = divps(auVar9,auVar10);
  auVar7 = minps(auVar4,auVar10);
  if (auVar7._0_4_ <= auVar7._4_4_) {
    auVar7._0_4_ = auVar7._4_4_;
  }
  auVar5 = maxps(auVar4,auVar10);
  if (auVar5._4_4_ <= auVar5._0_4_) {
    auVar5._0_4_ = auVar5._4_4_;
  }
  auVar12._0_4_ = b.min.z - r.start.z;
  auVar12._4_4_ = b.max.z - r.start.z;
  auVar12._8_4_ = b.max.y - r.start.z;
  auVar12._12_4_ = b.max.z - r.start.z;
  auVar1._4_4_ = r.direction.z;
  auVar1._0_4_ = r.direction.z;
  auVar1._8_4_ = r.direction.z;
  auVar1._12_4_ = r.direction.z;
  auVar13 = divps(auVar12,auVar1);
  fVar6 = auVar13._4_4_;
  auVar11 = auVar13;
  if (fVar6 <= auVar13._0_4_) {
    auVar11._4_12_ = auVar13._4_12_;
    auVar11._0_4_ = fVar6;
  }
  if (auVar7._0_4_ <= auVar11._0_4_) {
    auVar7._0_4_ = auVar11._0_4_;
  }
  if (auVar13._0_4_ <= fVar6) {
    auVar13._0_4_ = fVar6;
  }
  if (auVar13._0_4_ <= auVar5._0_4_) {
    auVar5._0_4_ = auVar13._0_4_;
  }
  if (auVar7._0_4_ <= 0.0) {
    auVar2._12_4_ = 0;
    auVar2._0_12_ = auVar7._4_12_;
    auVar7 = auVar2 << 0x20;
  }
  return auVar7._0_4_ < auVar5._0_4_;
}

Assistant:

bool
intersect_box3_ray3(box3_t b, ray3_t r) {
    // From the paper: An Efficient and Robust Ray–Box Intersection Algorithm by A. Williams et. al.
    // "... Note also that since IEEE arithmetic guarantees that a positive number divided by zero
    // is +\infinity and a negative number divided by zero is -\infinity, the code works for vertical
    // and horizontal line ..."
    float   tmin = -INFINITY, tmax = INFINITY;

    float   t0, t1;

    t0  = (b.min.x - r.start.x) / r.direction.x;
    t1  = (b.max.x - r.start.x) / r.direction.x;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));

    t0  = (b.min.y - r.start.y) / r.direction.y;
    t1  = (b.max.y - r.start.y) / r.direction.y;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));


    t0  = (b.min.z - r.start.z) / r.direction.z;
    t1  = (b.max.z - r.start.z) / r.direction.z;

    tmin    = MAX(tmin, MIN(t0, t1));
    tmax    = MIN(tmax, MAX(t0, t1));


    return tmax > MAX(tmin, 0.0f);
}